

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLinLin>::operator()
          (LineStripRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterYs<short> *pGVar6;
  ImDrawVert *pIVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  int iVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pGVar6 = this->Getter;
  iVar12 = pGVar6->Count;
  iVar3 = this->Transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar3].Min;
  IVar13.x = (float)(GImPlot->Mx *
                     (((double)(prim + 1) * pGVar6->XScale + pGVar6->X0) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  IVar13.y = (float)(GImPlot->My[iVar3] *
                     ((double)(int)*(short *)((long)pGVar6->Ys +
                                             (long)(((prim + 1 + pGVar6->Offset) % iVar12 + iVar12)
                                                   % iVar12) * (long)pGVar6->Stride) -
                     GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar1.y);
  fVar14 = (this->P1).x;
  fVar15 = (this->P1).y;
  auVar19._0_4_ = ~-(uint)(IVar13.x <= fVar14) & (uint)IVar13.x;
  auVar19._4_4_ = ~-(uint)(IVar13.y <= fVar15) & (uint)IVar13.y;
  auVar19._8_4_ = ~-(uint)(fVar14 < IVar13.x) & (uint)IVar13.x;
  auVar19._12_4_ = ~-(uint)(fVar15 < IVar13.y) & (uint)IVar13.y;
  auVar10._4_4_ = (uint)fVar15 & -(uint)(IVar13.y <= fVar15);
  auVar10._0_4_ = (uint)fVar14 & -(uint)(IVar13.x <= fVar14);
  auVar10._8_4_ = (uint)fVar14 & -(uint)(fVar14 < IVar13.x);
  auVar10._12_4_ = (uint)fVar15 & -(uint)(fVar15 < IVar13.y);
  auVar19 = auVar19 | auVar10;
  fVar16 = (cull_rect->Min).y;
  auVar11._4_8_ = auVar19._8_8_;
  auVar11._0_4_ = -(uint)(auVar19._4_4_ < fVar16);
  auVar20._0_8_ = auVar11._0_8_ << 0x20;
  auVar20._8_4_ = -(uint)(auVar19._8_4_ < (cull_rect->Max).x);
  auVar20._12_4_ = -(uint)(auVar19._12_4_ < (cull_rect->Max).y);
  auVar21._4_4_ = -(uint)(fVar16 < auVar19._4_4_);
  auVar21._0_4_ = -(uint)((cull_rect->Min).x < auVar19._0_4_);
  auVar21._8_8_ = auVar20._8_8_;
  iVar12 = movmskps((int)GImPlot,auVar21);
  if (iVar12 == 0xf) {
    IVar4 = this->Col;
    IVar1 = *uv;
    fVar16 = IVar13.x - fVar14;
    fVar17 = IVar13.y - fVar15;
    fVar18 = fVar16 * fVar16 + fVar17 * fVar17;
    if (0.0 < fVar18) {
      fVar18 = 1.0 / SQRT(fVar18);
      fVar16 = fVar16 * fVar18;
      fVar17 = fVar17 * fVar18;
    }
    fVar18 = this->Weight * 0.5;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->uv = IVar1;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar4;
    fVar16 = fVar18 * fVar16;
    fVar18 = fVar18 * fVar17;
    (pIVar7->pos).x = fVar14 + fVar18;
    (pIVar7->pos).y = fVar15 - fVar16;
    pIVar8[1].pos.x = fVar18 + IVar13.x;
    pIVar8[1].pos.y = IVar13.y - fVar16;
    pIVar8[1].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar4;
    pIVar7[2].pos.x = IVar13.x - fVar18;
    pIVar7[2].pos.y = fVar16 + IVar13.y;
    pIVar7[2].uv = IVar1;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar4;
    IVar2 = this->P1;
    pIVar7[3].pos.x = IVar2.x - fVar18;
    pIVar7[3].pos.y = IVar2.y + fVar16;
    pIVar7[3].uv.x = IVar1.x;
    pIVar7[3].uv.y = IVar1.y;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = uVar5;
    puVar9[1] = uVar5 + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar9[3] = uVar5;
    puVar9[4] = uVar5 + 2;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar13;
  return (char)iVar12 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }